

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
gtl::internal_btree::
btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
::increment(btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
            *this)

{
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *pbVar1;
  int iVar2;
  
  pbVar1 = this->node;
  if (((ulong)pbVar1 & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                  ,0x1e1,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  if ((pbVar1[0xb] !=
       (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
        )0x0) &&
     (iVar2 = this->position + 1, this->position = iVar2, iVar2 < (int)(uint)(byte)pbVar1[10])) {
    return;
  }
  increment_slow(this);
  return;
}

Assistant:

void increment() {
    if (node->leaf() && ++position < node->count()) {
      return;
    }
    increment_slow();
  }